

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

CScaledGlyph * allocator_default<CScaledGlyph>::alloc_array(int size)

{
  CScaledGlyph *pCVar1;
  ulong uVar2;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar2 = (ulong)(uint)size << 6;
  }
  pCVar1 = (CScaledGlyph *)operator_new__(uVar2);
  return pCVar1;
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }